

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupOneHot(Gia_Man_t *p)

{
  Gia_Man_t *pNew;
  Gia_Man_t *pTwo;
  int nVars;
  int nSkips;
  
  pNew = Gia_ManDup(p);
  nVars = pNew->nRegs;
  if (nVars == 0) {
    Abc_Print(0,"Appending 1-hotness constraints to the PIs.\n");
    nVars = pNew->vCis->nSize;
    nSkips = 0;
  }
  else {
    nSkips = pNew->vCis->nSize - nVars;
  }
  pTwo = Gia_ManOneHot(nSkips,nVars);
  Gia_ManDupAppendShare(pNew,pTwo);
  pNew->nConstrs = pNew->nConstrs + (pTwo->vCos->nSize - pTwo->nRegs);
  Gia_ManStop(pTwo);
  return pNew;
}

Assistant:

Gia_Man_t * Gia_ManDupOneHot( Gia_Man_t * p )
{
    Gia_Man_t * pOneHot, * pNew = Gia_ManDup( p );
    if ( Gia_ManRegNum(pNew) == 0 )
    {
        Abc_Print( 0, "Appending 1-hotness constraints to the PIs.\n" );
        pOneHot = Gia_ManOneHot( 0, Gia_ManCiNum(pNew) );
    }
    else
        pOneHot = Gia_ManOneHot( Gia_ManPiNum(pNew), Gia_ManRegNum(pNew) );
    Gia_ManDupAppendShare( pNew, pOneHot );
    pNew->nConstrs += Gia_ManPoNum(pOneHot);
    Gia_ManStop( pOneHot );
    return pNew;
}